

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_>_>::dispose
          (Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_>_> *this)

{
  AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_> *object;
  AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_> *ptrCopy;
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_>_> *this_local;
  
  object = this->ptr;
  if (object != (AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_> *)0x0) {
    this->ptr = (AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_> *)0x0;
    Disposer::dispose<kj::_::AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>>
              (this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }